

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_clone_alloc(wally_tx *tx,uint32_t flags,wally_tx **output)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  undefined1 free_parent;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  wally_tx *result;
  wally_tx *local_30;
  
  local_30 = (wally_tx *)0x0;
  iVar3 = -2;
  if (output != (wally_tx **)0x0) {
    *output = (wally_tx *)0x0;
    _Var2 = is_valid_tx(tx);
    if (flags == 0 && _Var2) {
      uVar4 = (ulong)tx->locktime;
      iVar3 = wally_tx_init_alloc(tx->version,tx->locktime,tx->num_inputs,tx->num_outputs,&local_30)
      ;
      if ((iVar3 == 0) && (tx->num_inputs != 0)) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          if (local_30 == (wally_tx *)0x0) {
            iVar3 = -2;
          }
          else {
            uVar1 = (uint)local_30->num_inputs;
            uVar4 = (ulong)uVar1;
            iVar3 = wally_tx_add_input_at
                              (local_30,uVar1,(wally_tx_input *)(tx->inputs->txhash + lVar6));
          }
          if (iVar3 != 0) break;
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0xd0;
        } while (uVar5 < tx->num_inputs);
      }
      free_parent = (undefined1)uVar4;
      if (iVar3 == 0) {
        if (tx->num_outputs != 0) {
          lVar6 = 0;
          uVar5 = 0;
          do {
            if (local_30 == (wally_tx *)0x0) {
              iVar3 = -2;
            }
            else {
              uVar1 = (uint)local_30->num_outputs;
              uVar4 = (ulong)uVar1;
              iVar3 = wally_tx_add_output_at
                                (local_30,uVar1,
                                 (wally_tx_output *)((long)&tx->outputs->satoshi + lVar6));
            }
            free_parent = (undefined1)uVar4;
            if (iVar3 != 0) goto LAB_003c039d;
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x70;
          } while (uVar5 < tx->num_outputs);
        }
        *output = local_30;
      }
      else {
LAB_003c039d:
        tx_free(local_30,(_Bool)free_parent);
      }
    }
  }
  return iVar3;
}

Assistant:

int wally_tx_clone_alloc(const struct wally_tx *tx, uint32_t flags, struct wally_tx **output)
{
    size_t i;
    struct wally_tx *result = NULL;
    int ret;

    TX_CHECK_OUTPUT;

    if (!is_valid_tx(tx) || flags != 0)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(tx->version, tx->locktime, tx->num_inputs, tx->num_outputs, &result);

    for (i = 0; ret == WALLY_OK && i < tx->num_inputs; ++i)
        ret = wally_tx_add_input(result, &tx->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < tx->num_outputs; ++i)
        ret = wally_tx_add_output(result, &tx->outputs[i]);

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);

    return ret;
}